

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *results,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *patch)

{
  bool bVar1;
  walk_result wVar2;
  json_pointer *pjVar3;
  undefined8 in_RCX;
  char *in_RSI;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDI;
  validation_message *in_stack_00000008;
  walk_result result;
  collecting_error_listener local_reporter;
  evaluation_results local_results;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  undefined4 in_stack_fffffffffffffd80;
  walk_result in_stack_fffffffffffffd84;
  json_pointer *in_stack_fffffffffffffd88;
  evaluation_results *in_stack_fffffffffffffd90;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string local_238 [32];
  evaluation_results *in_stack_fffffffffffffde8;
  evaluation_results *in_stack_fffffffffffffdf0;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_70;
  undefined8 local_28;
  walk_result local_4;
  
  local_28 = in_RCX;
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
  keyword_name_abi_cxx11_
            ((keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              *)in_RDI);
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(in_RDI,(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffda0);
  evaluation_results::evaluation_results(in_stack_fffffffffffffd90);
  collecting_error_listener::collecting_error_listener
            ((collecting_error_listener *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ::operator->((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                *)0x756962);
  wVar2 = validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::validate((validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     (evaluation_results *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (error_reporter *)in_stack_00000008,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_RDI);
  if (wVar2 == abort) {
    local_4 = abort;
  }
  else {
    bVar1 = std::
            vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
            ::empty((vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
                     *)in_stack_fffffffffffffd90);
    if (bVar1) {
      pjVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::eval_path(&local_70);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdc0,in_RSI,(allocator<char> *)in_RDI);
      (*(code *)(in_RDI->dynamic_scope_).
                super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[2])
                (&stack0xfffffffffffffde8,in_RDI,pjVar3,local_28,local_238);
      wVar2 = error_reporter::error
                        ((error_reporter *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         in_stack_00000008);
      in_stack_fffffffffffffd84 = wVar2;
      validation_message::~validation_message
                ((validation_message *)CONCAT44(wVar2,in_stack_fffffffffffffd80));
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
      if (wVar2 == abort) {
        local_4 = abort;
        goto LAB_00756bac;
      }
    }
    else {
      evaluation_results::merge(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    }
    local_4 = advance;
  }
LAB_00756bac:
  collecting_error_listener::~collecting_error_listener
            ((collecting_error_listener *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  evaluation_results::~evaluation_results
            ((evaluation_results *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  return local_4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            evaluation_results local_results;
            collecting_error_listener local_reporter;
            walk_result result = schema_val_->validate(this_context, instance, instance_location, local_results, local_reporter, patch);
            if (result == walk_result::abort)
            {
                return result;
            }

            if (local_reporter.errors.empty())
            {
                result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "Instance must not be valid against schema"));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            else
            {
                results.merge(local_results);
            }
            return walk_result::advance;
        }